

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapePRG.cpp
# Opt level: O0

void __thiscall Storage::Tape::PRG::PRG(PRG *this,string *file_name)

{
  uint16_t uVar1;
  stat *psVar2;
  undefined4 *puVar3;
  string *file_name_local;
  PRG *this_local;
  
  Tape::Tape(&this->super_Tape);
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_00cab4b0;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  this->file_phase_ = FilePhaseLeadIn;
  this->phase_offset_ = 0;
  this->bit_phase_ = 3;
  this->copy_mask_ = 0x80;
  psVar2 = FileHolder::stats(&this->file_);
  if (psVar2->st_size < 0x10002) {
    psVar2 = FileHolder::stats(&this->file_);
    if (2 < psVar2->st_size) {
      uVar1 = FileHolder::get16le(&this->file_);
      this->load_address_ = uVar1;
      psVar2 = FileHolder::stats(&this->file_);
      this->length_ = (short)psVar2->st_size - 2;
      if (0xffff < (uint)this->load_address_ + (uint)this->length_) {
        puVar3 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar3 = 0;
        __cxa_throw(puVar3,&{unnamed_type#1}::typeinfo,0);
      }
      return;
    }
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&{unnamed_type#1}::typeinfo,0);
}

Assistant:

PRG::PRG(const std::string &file_name) :
	file_(file_name)
{
	// There's really no way to validate other than that if this file is larger than 64kb,
	// of if load address + length > 65536 then it's broken.
	if(file_.stats().st_size >= 65538 || file_.stats().st_size < 3)
		throw ErrorBadFormat;

	load_address_ = file_.get16le();
	length_ = uint16_t(file_.stats().st_size - 2);

	if (load_address_ + length_ >= 65536)
		throw ErrorBadFormat;
}